

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::DoVerticalBar(ParseState *this)

{
  Regexp *this_00;
  Regexp *this_01;
  bool bVar1;
  RegexpOp RVar2;
  ParseState *in_RDI;
  Regexp *r3;
  Regexp *r2;
  Regexp *r1;
  Regexp *this_02;
  ParseState *this_03;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_03 = in_RDI;
  MaybeConcatString((ParseState *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                    (int)((ulong)in_RDI >> 0x20),(ParseFlags)in_RDI);
  DoConcatenation(this_03);
  this_02 = in_RDI->stacktop_;
  if (((this_02 == (Regexp *)0x0) || (this_00 = this_02->down_, this_00 == (Regexp *)0x0)) ||
     (RVar2 = Regexp::op(this_00), RVar2 != (kRegexpCharClass|kRegexpLiteral))) {
    bVar1 = PushSimpleOp(this_03,(RegexpOp)((ulong)this_02 >> 0x20));
    return bVar1;
  }
  this_01 = this_00->down_;
  if ((this_01 != (Regexp *)0x0) &&
     ((RVar2 = Regexp::op(this_02), RVar2 == kRegexpAnyChar ||
      (RVar2 = Regexp::op(this_01), RVar2 == kRegexpAnyChar)))) {
    RVar2 = Regexp::op(this_01);
    if ((RVar2 == kRegexpAnyChar) &&
       (((RVar2 = Regexp::op(this_02), RVar2 == kRegexpLiteral ||
         (RVar2 = Regexp::op(this_02), RVar2 == kRegexpCharClass)) ||
        (RVar2 = Regexp::op(this_02), RVar2 == kRegexpAnyChar)))) {
      in_RDI->stacktop_ = this_00;
      Decref(r1);
      return true;
    }
    RVar2 = Regexp::op(this_02);
    if ((RVar2 == kRegexpAnyChar) &&
       (((RVar2 = Regexp::op(this_01), RVar2 == kRegexpLiteral ||
         (RVar2 = Regexp::op(this_01), RVar2 == kRegexpCharClass)) ||
        (RVar2 = Regexp::op(this_01), RVar2 == kRegexpAnyChar)))) {
      this_02->down_ = this_01->down_;
      this_00->down_ = this_02;
      in_RDI->stacktop_ = this_00;
      Decref(r1);
      return true;
    }
  }
  this_02->down_ = this_00->down_;
  this_00->down_ = this_02;
  in_RDI->stacktop_ = this_00;
  return true;
}

Assistant:

bool Regexp::ParseState::DoVerticalBar() {
  MaybeConcatString(-1, NoParseFlags);
  DoConcatenation();

  // Below the vertical bar is a list to alternate.
  // Above the vertical bar is a list to concatenate.
  // We just did the concatenation, so either swap
  // the result below the vertical bar or push a new
  // vertical bar on the stack.
  Regexp* r1;
  Regexp* r2;
  if ((r1 = stacktop_) != NULL &&
      (r2 = r1->down_) != NULL &&
      r2->op() == kVerticalBar) {
    Regexp* r3;
    if ((r3 = r2->down_) != NULL &&
        (r1->op() == kRegexpAnyChar || r3->op() == kRegexpAnyChar)) {
      // AnyChar is above or below the vertical bar. Let it subsume
      // the other when the other is Literal, CharClass or AnyChar.
      if (r3->op() == kRegexpAnyChar &&
          (r1->op() == kRegexpLiteral ||
           r1->op() == kRegexpCharClass ||
           r1->op() == kRegexpAnyChar)) {
        // Discard r1.
        stacktop_ = r2;
        r1->Decref();
        return true;
      }
      if (r1->op() == kRegexpAnyChar &&
          (r3->op() == kRegexpLiteral ||
           r3->op() == kRegexpCharClass ||
           r3->op() == kRegexpAnyChar)) {
        // Rearrange the stack and discard r3.
        r1->down_ = r3->down_;
        r2->down_ = r1;
        stacktop_ = r2;
        r3->Decref();
        return true;
      }
    }
    // Swap r1 below vertical bar (r2).
    r1->down_ = r2->down_;
    r2->down_ = r1;
    stacktop_ = r2;
    return true;
  }
  return PushSimpleOp(kVerticalBar);
}